

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

int doctest::detail::nameOrderComparator(void *a,void *b)

{
  int iVar1;
  
  iVar1 = strcmp(*(char **)(*a + 8),*(char **)(*b + 8));
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = suiteOrderComparator(a,b);
  return iVar1;
}

Assistant:

int nameOrderComparator(const void* a, const void* b) {
        const TestData* lhs = *static_cast<TestData* const*>(a);
        const TestData* rhs = *static_cast<TestData* const*>(b);

        int res = strcmp(lhs->m_name, rhs->m_name);
        if(res != 0)
            return res;
        return suiteOrderComparator(a, b);
    }